

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableRequiresCommand.h
# Opt level: O0

cmCommand * __thiscall cmVariableRequiresCommand::Clone(cmVariableRequiresCommand *this)

{
  cmCommand *this_00;
  cmVariableRequiresCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmVariableRequiresCommand((cmVariableRequiresCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmVariableRequiresCommand; }